

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

JavascriptProxy * Js::JavascriptProxy::Create(ScriptContext *scriptContext,Arguments *args)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  Var aValue;
  Var pvVar5;
  undefined4 *puVar6;
  DynamicObject *obj;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptProxy *pJVar7;
  DynamicObject *obj_00;
  Recycler *alloc;
  RecyclableObject *pRVar8;
  PCWSTR varName;
  Type TVar9;
  undefined1 local_88 [8];
  TrackAllocData data;
  
  aValue = CallInfo::GetNewTarget
                     (*(uint *)&args->Info >> 0x18,args->Values,*(uint *)&args->Info & 0xffffff);
  data._32_8_ = args->Info;
  bVar2 = JavascriptOperators::IsConstructorSuperCall((Arguments *)&data.line);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea18,(PCWSTR)0x0);
  }
  pvVar5 = Arguments::operator[](args,1);
  if (pvVar5 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00cf5c00;
    *puVar6 = 0;
LAB_00cf5786:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cf5c00;
      *puVar6 = 0;
    }
    TVar9 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar9) {
      BVar4 = RecyclableObject::IsExternal(pRVar8);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00cf5c00;
        goto LAB_00cf5856;
      }
    }
  }
  else if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    TVar9 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar9 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) goto LAB_00cf5786;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00cf5c00;
    TVar9 = TypeIds_FirstNumberType;
LAB_00cf5856:
    *puVar6 = 0;
  }
  BVar4 = JavascriptOperators::IsObjectType(TVar9);
  if (BVar4 == 0) {
LAB_00cf5c02:
    varName = L"target";
    goto LAB_00cf5c12;
  }
  pvVar5 = Arguments::operator[](args,1);
  obj = VarTo<Js::DynamicObject>(pvVar5);
  if (obj != (DynamicObject *)0x0) {
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(obj);
    if (bVar3) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(obj);
      if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
    }
  }
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(&obj->super_RecyclableObject);
  if (bVar3) {
    pJVar7 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(&obj->super_RecyclableObject);
    bVar3 = IsRevoked(pJVar7);
    if (bVar3) goto LAB_00cf5c02;
  }
  pvVar5 = Arguments::operator[](args,2);
  if (pvVar5 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00cf5c00;
    *puVar6 = 0;
LAB_00cf59e8:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cf5c00;
      *puVar6 = 0;
    }
    TVar9 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar9) {
      BVar4 = RecyclableObject::IsExternal(pRVar8);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00cf5c00:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        goto LAB_00cf5ab8;
      }
    }
  }
  else if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    TVar9 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar9 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) goto LAB_00cf59e8;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00cf5c00;
    TVar9 = TypeIds_FirstNumberType;
LAB_00cf5ab8:
    *puVar6 = 0;
  }
  BVar4 = JavascriptOperators::IsObjectType(TVar9);
  if (BVar4 != 0) {
    pvVar5 = Arguments::operator[](args,2);
    obj_00 = VarTo<Js::DynamicObject>(pvVar5);
    bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(&obj_00->super_RecyclableObject);
    if (!bVar3) {
LAB_00cf5b2c:
      local_88 = (undefined1  [8])&typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_7c4a12e;
      data.filename._0_4_ = 0x66;
      alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_88);
      pJVar7 = (JavascriptProxy *)new<Memory::Recycler>(0x30,alloc,0x387914);
      JavascriptProxy(pJVar7,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             proxyType).ptr,scriptContext,&obj->super_RecyclableObject,
                      &obj_00->super_RecyclableObject);
      bVar3 = JavascriptConversion::IsCallable(&obj->super_RecyclableObject);
      if (bVar3) {
        DynamicObject::ChangeType((DynamicObject *)pJVar7);
        ((pJVar7->super_DynamicObject).super_RecyclableObject.type.ptr)->entryPoint =
             FunctionCallTrap;
      }
      if (bVar2) {
        pRVar8 = VarTo<Js::RecyclableObject>(aValue);
        pRVar8 = JavascriptOperators::OrdinaryCreateFromConstructor
                           (pRVar8,(RecyclableObject *)pJVar7,(DynamicObject *)0x0,scriptContext);
        pJVar7 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(pRVar8);
      }
      return pJVar7;
    }
    pJVar7 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(&obj_00->super_RecyclableObject);
    bVar3 = IsRevoked(pJVar7);
    if (!bVar3) goto LAB_00cf5b2c;
  }
  varName = L"handler";
LAB_00cf5c12:
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea17,varName);
}

Assistant:

JavascriptProxy* JavascriptProxy::Create(ScriptContext* scriptContext, Arguments args)
    {
        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);

        RecyclableObject* target, *handler;

        if (args.Info.Count < 3)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedProxyArgument);
        }

        if (!JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(args[1])))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("target"));
        }
        target = VarTo<DynamicObject>(args[1]);
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(target);
#endif
        if (VarIs<JavascriptProxy>(target))
        {
            if (UnsafeVarTo<JavascriptProxy>(target)->IsRevoked())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("target"));
            }
        }

        if (!JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(args[2])))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("handler"));
        }
        handler = VarTo<DynamicObject>(args[2]);
        if (VarIs<JavascriptProxy>(handler))
        {
            if (UnsafeVarTo<JavascriptProxy>(handler)->IsRevoked())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidProxyArgument, _u("handler"));
            }
        }

        JavascriptProxy* newProxy = RecyclerNew(scriptContext->GetRecycler(), JavascriptProxy, scriptContext->GetLibrary()->GetProxyType(), scriptContext, target, handler);
        if (JavascriptConversion::IsCallable(target))
        {
            newProxy->ChangeType();
            newProxy->GetDynamicType()->SetEntryPoint(JavascriptProxy::FunctionCallTrap);
        }
        return isCtorSuperCall ?
            VarTo<JavascriptProxy>(JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), newProxy, nullptr, scriptContext)) :
            newProxy;
    }